

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdvalue.cpp
# Opt level: O0

Am_Wrapper * __thiscall Am_Double_Data::Make_Unique(Am_Double_Data *this)

{
  bool bVar1;
  Am_Double_Data *this_local;
  
  bVar1 = Am_Wrapper::Is_Unique(&this->super_Am_Wrapper);
  this_local = this;
  if (!bVar1) {
    Am_Wrapper::Release(&this->super_Am_Wrapper);
    this_local = (Am_Double_Data *)operator_new(0x18);
    Am_Double_Data(this_local,this->value);
  }
  return &this_local->super_Am_Wrapper;
}

Assistant:

bool
Am_Double_Data::operator==(const Am_Double_Data &test_value) const
{
  return (this == &test_value) || ((double)test_value == value);
}